

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O3

int coda_get_product_type(coda_product *product,char **product_type)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (product == (coda_product *)0x0) {
    pcVar2 = "product file argument is NULL (%s:%u)";
    uVar1 = 0x3c6;
  }
  else {
    if (product_type != (char **)0x0) {
      if (product->product_definition == (coda_product_definition *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = product->product_definition->product_type->name;
      }
      *product_type = pcVar2;
      return 0;
    }
    pcVar2 = "product_type argument is NULL (%s:%u)";
    uVar1 = 0x3cb;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                 ,uVar1);
  return -1;
}

Assistant:

LIBCODA_API int coda_get_product_type(const coda_product *product, const char **product_type)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (product_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product->product_definition != NULL)
    {
        *product_type = product->product_definition->product_type->name;
    }
    else
    {
        *product_type = NULL;
    }

    return 0;
}